

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

CppType __thiscall google::protobuf::MapValueConstRef::type(MapValueConstRef *this)

{
  LogMessage *pLVar1;
  LogMessage local_28;
  Voidify local_11;
  MapValueConstRef *local_10;
  MapValueConstRef *this_local;
  
  if ((this->type_ != 0) && (this->data_ != (void *)0x0)) {
    return this->type_;
  }
  local_10 = this;
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field.h"
             ,0x2b2);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar1,(char (*) [34])"Protocol Buffer map usage error:\n");
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar1,(char (*) [60])
                             "MapValueConstRef::type MapValueConstRef is not initialized.");
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar1);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
}

Assistant:

FieldDescriptor::CppType type() const {
    if (type_ == FieldDescriptor::CppType() || data_ == nullptr) {
      ABSL_LOG(FATAL)
          << "Protocol Buffer map usage error:\n"
          << "MapValueConstRef::type MapValueConstRef is not initialized.";
    }
    return type_;
  }